

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c9fea::AddInteractionBPM_self_loop_SPIN_Test::
~AddInteractionBPM_self_loop_SPIN_Test(AddInteractionBPM_self_loop_SPIN_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AddInteractionBPM, self_loop_SPIN) {
   
   Polynomial<uint32_t, double> polynomial {
      {{1}, 1.0}, {{2}, 2.0},
      {{1, 2}, 12.0},
      {{1, 2, 3}, 123.0}
   };
   
   BinaryPolynomialModel<uint32_t, double> bpm(polynomial, Vartype::SPIN);
   
   bpm.AddInteraction({3, 3, 3}, 3.0);
   bpm.AddInteraction({4, 4, 4, 4, 4}, 4.0);
   bpm.AddInteraction({1, 3, 1, 3, 3, 1}, 13.0);
   bpm.AddInteraction({1, 1, 1, 4, 4, 4}, 14.0);
   bpm.AddInteraction({3, 3, 3, 2, 2, 2}, 23.0);
   bpm.AddInteraction({2, 4}, 24.0);
   bpm.AddInteraction({3, 4}, 34.0);
   bpm.AddInteraction({1, 2, 4}, 124.0);
   bpm.AddInteraction({1, 3, 4}, 134.0);
   bpm.AddInteraction({2, 3, 4, 2, 4, 3, 3, 4, 2}, 234.0);
   bpm.AddInteraction({1, 2, 3, 4}, 1234.0);
   
   StateTestBPMUINT(bpm);

}